

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O3

Item * jbcoin::getTxFormat(TxType type)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  TxFormats::getInstance();
  if (TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t.
              _M_impl.super__Rb_tree_header._M_header;
    p_Var2 = TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t.
             _M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (type <= (int)p_Var2[1]._M_color) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < type];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var1 !=
          &TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t._M_impl.
           super__Rb_tree_header) && ((int)p_Var1[1]._M_color <= type)) &&
       ((Item *)p_Var1[1]._M_parent != (Item *)0x0)) {
      return (Item *)p_Var1[1]._M_parent;
    }
  }
  std::__cxx11::to_string(&local_30,type);
  std::operator+(&local_50,"Invalid transaction type ",&local_30);
  Throw<std::runtime_error,std::__cxx11::string>(&local_50);
}

Assistant:

static
auto getTxFormat (TxType type)
{
    auto format = TxFormats::getInstance().findByType (type);

    if (format == nullptr)
    {
        Throw<std::runtime_error> (
            "Invalid transaction type " +
            std::to_string (
                static_cast<std::underlying_type_t<TxType>>(type)));
    }

    return format;
}